

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter_inl.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_usage(string *__return_storage_ptr__,Formatter *this,App *app,string *name)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  size_type __n;
  size_t sVar4;
  string *delim;
  char *pcVar5;
  allocator local_419;
  string local_418;
  string local_3f8;
  anon_class_1_0_00000001 local_3d1;
  function<bool_(const_CLI::App_*)> local_3d0;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_3b0;
  allocator local_391;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  Formatter *local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_338;
  __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
  local_330;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_321;
  undefined1 local_320 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  positional_names;
  function<bool_(const_CLI::Option_*)> local_300;
  undefined1 local_2e0 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> positionals;
  string local_2c0;
  string local_2a0;
  anon_class_1_0_00000001 local_279;
  function<bool_(const_CLI::Option_*)> local_278;
  undefined1 local_258 [8];
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> non_pos_options;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  string local_220;
  string local_200;
  stringstream local_1e0 [8];
  stringstream out;
  ostream local_1d0 [376];
  undefined4 local_58;
  undefined1 local_48 [8];
  string usage;
  string *name_local;
  App *app_local;
  Formatter *this_local;
  
  usage.field_2._8_8_ = name;
  App::get_usage_abi_cxx11_((string *)local_48,app);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    ::std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                     "\n\n");
    local_58 = 1;
  }
  else {
    ::std::__cxx11::stringstream::stringstream(local_1e0);
    ::std::operator<<(local_1d0,'\n');
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::operator<<(local_1d0,(string *)name);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_220,"Usage",
                 (allocator *)
                 ((long)&groups.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      FormatterBase::get_label(&local_200,&this->super_FormatterBase,&local_220);
      poVar3 = ::std::operator<<(local_1d0,(string *)&local_200);
      ::std::operator<<(poVar3,':');
      ::std::__cxx11::string::~string((string *)&local_200);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&groups.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    App::get_groups_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&non_pos_options.
                   super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage,app);
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_1_,void>
              ((function<bool(CLI::Option_const*)> *)&local_278,&local_279);
    App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_258,
                     app,&local_278);
    std::function<bool_(const_CLI::Option_*)>::~function(&local_278);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       local_258);
    if (!bVar1) {
      poVar3 = ::std::operator<<(local_1d0," [");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&local_2c0,"OPTIONS",
                 (allocator *)
                 ((long)&positionals.
                         super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      FormatterBase::get_label(&local_2a0,&this->super_FormatterBase,&local_2c0);
      poVar3 = ::std::operator<<(poVar3,(string *)&local_2a0);
      ::std::operator<<(poVar3,"]");
      ::std::__cxx11::string::~string((string *)&local_2a0);
      ::std::__cxx11::string::~string((string *)&local_2c0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&positionals.
                         super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
    ::std::function<bool(CLI::Option_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_2_,void>
              ((function<bool(CLI::Option_const*)> *)&local_300,
               (anon_class_1_0_00000001 *)
               ((long)&positional_names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    App::get_options((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2e0,
                     app,&local_300);
    std::function<bool_(const_CLI::Option_*)>::~function(&local_300);
    bVar1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::empty
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       local_2e0);
    if (!bVar1) {
      __n = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::size
                      ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)
                       local_2e0);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_321);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_320,__n,&local_321);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_321);
      local_330._M_current =
           (Option **)
           std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin
                     ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2e0
                     );
      local_338._M_current =
           (Option **)
           std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end
                     ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2e0
                     );
      local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_320);
      delim = (string *)this;
      local_348 = this;
      local_350 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ::std::
                  transform<__gnu_cxx::__normal_iterator<CLI::Option_const**,std::vector<CLI::Option_const*,std::allocator<CLI::Option_const*>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::Option_const*)_3_>
                            (local_330,local_338,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_340,(anon_class_8_1_8991fb9c)this);
      poVar3 = ::std::operator<<(local_1d0," ");
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_390," ",&local_391);
      detail::join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&local_370,(detail *)local_320,&local_390,delim);
      ::std::operator<<(poVar3,(string *)&local_370);
      ::std::__cxx11::string::~string((string *)&local_370);
      ::std::__cxx11::string::~string((string *)&local_390);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_391);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_320);
    }
    ::std::function<bool(CLI::App_const*)>::
    function<CLI::Formatter::make_usage(CLI::App_const*,std::__cxx11::string)const::_lambda(CLI::App_const*)_1_,void>
              ((function<bool(CLI::App_const*)> *)&local_3d0,&local_3d1);
    App::get_subcommands(&local_3b0,app,&local_3d0);
    bVar1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::empty(&local_3b0);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector(&local_3b0);
    std::function<bool_(const_CLI::App_*)>::~function(&local_3d0);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      poVar3 = ::std::operator<<(local_1d0,' ');
      sVar4 = App::get_require_subcommand_min(app);
      pcVar5 = "";
      if (sVar4 == 0) {
        pcVar5 = "[";
      }
      poVar3 = ::std::operator<<(poVar3,pcVar5);
      sVar4 = App::get_require_subcommand_max(app);
      bVar1 = true;
      if (1 < sVar4) {
        sVar4 = App::get_require_subcommand_min(app);
        bVar1 = 1 < sVar4;
      }
      pcVar5 = "SUBCOMMANDS";
      if (bVar1) {
        pcVar5 = "SUBCOMMAND";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_418,pcVar5,&local_419);
      FormatterBase::get_label(&local_3f8,&this->super_FormatterBase,&local_418);
      poVar3 = ::std::operator<<(poVar3,(string *)&local_3f8);
      sVar4 = App::get_require_subcommand_min(app);
      pcVar5 = "";
      if (sVar4 == 0) {
        pcVar5 = "]";
      }
      ::std::operator<<(poVar3,pcVar5);
      ::std::__cxx11::string::~string((string *)&local_3f8);
      ::std::__cxx11::string::~string((string *)&local_418);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
    ::std::operator<<(local_1d0,"\n\n");
    ::std::__cxx11::stringstream::str();
    local_58 = 1;
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_2e0);
    std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector
              ((vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *)local_258);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&non_pos_options.
                  super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  ::std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string Formatter::make_usage(const App *app, std::string name) const {
    std::string usage = app->get_usage();
    if(!usage.empty()) {
        return usage + "\n\n";
    }

    std::stringstream out;
    out << '\n';

    if(name.empty())
        out << get_label("Usage") << ':';
    else
        out << name;

    std::vector<std::string> groups = app->get_groups();

    // Print an Options badge if any options exist
    std::vector<const Option *> non_pos_options =
        app->get_options([](const Option *opt) { return opt->nonpositional(); });
    if(!non_pos_options.empty())
        out << " [" << get_label("OPTIONS") << "]";

    // Positionals need to be listed here
    std::vector<const Option *> positionals = app->get_options([](const Option *opt) { return opt->get_positional(); });

    // Print out positionals if any are left
    if(!positionals.empty()) {
        // Convert to help names
        std::vector<std::string> positional_names(positionals.size());
        std::transform(positionals.begin(), positionals.end(), positional_names.begin(), [this](const Option *opt) {
            return make_option_usage(opt);
        });

        out << " " << detail::join(positional_names, " ");
    }

    // Add a marker if subcommands are expected or optional
    if(!app->get_subcommands(
               [](const CLI::App *subc) { return ((!subc->get_disabled()) && (!subc->get_name().empty())); })
            .empty()) {
        out << ' ' << (app->get_require_subcommand_min() == 0 ? "[" : "")
            << get_label(app->get_require_subcommand_max() < 2 || app->get_require_subcommand_min() > 1 ? "SUBCOMMAND"
                                                                                                        : "SUBCOMMANDS")
            << (app->get_require_subcommand_min() == 0 ? "]" : "");
    }

    out << "\n\n";

    return out.str();
}